

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O3

int32_t utrie2_serialize_63(UTrie2 *trie,void *data,int32_t capacity,UErrorCode *pErrorCode)

{
  int iVar1;
  
  iVar1 = 0;
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if ((((trie == (UTrie2 *)0x0) || (trie->memory == (void *)0x0)) || (capacity < 0)) ||
     ((trie->newTrie != (UNewTrie2 *)0x0 ||
      ((capacity != 0 && (data == (void *)0x0 || ((ulong)data & 3) != 0)))))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    iVar1 = trie->length;
    if (capacity < iVar1) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else {
      memcpy(data,trie->memory,(long)iVar1);
      iVar1 = trie->length;
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_serialize(const UTrie2 *trie,
                 void *data, int32_t capacity,
                 UErrorCode *pErrorCode) {
    /* argument check */
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( trie==NULL || trie->memory==NULL || trie->newTrie!=NULL ||
        capacity<0 || (capacity>0 && (data==NULL || (U_POINTER_MASK_LSB(data, 3)!=0)))
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if(capacity>=trie->length) {
        uprv_memcpy(data, trie->memory, trie->length);
    } else {
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
    return trie->length;
}